

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

ObjectSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  runtime_error *this_00;
  undefined8 *puVar6;
  long lVar7;
  anon_class_16_2_f160e5ca *paVar8;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  anon_class_16_2_f160e5ca *paVar14;
  uint *puVar15;
  size_t sVar16;
  bool bVar17;
  float fVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  float fVar29;
  float fVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  uint uVar34;
  uint uVar36;
  uint uVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  uint uVar38;
  undefined1 auVar39 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  float fVar42;
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  float fVar53;
  float fVar54;
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  task_group_context *in_stack_ffffffffffffe0c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ef0;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 local_1ed0;
  anon_class_16_2_ed117de8_conflict5 local_1ec8;
  float local_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float fStack_1ea4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ea0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e90;
  task_group_context local_1e80 [3];
  undefined8 auStack_1cd0 [2];
  undefined8 auStack_1cc0 [2];
  undefined8 auStack_1cb0 [2];
  undefined8 auStack_1ca0 [2];
  undefined8 auStack_1c90 [2];
  undefined1 local_1c80 [3580];
  undefined4 uStack_e84;
  undefined1 local_e80 [20];
  float afStack_e6c [911];
  
  puVar6 = (undefined8 *)(local_1c80 + 0xc00);
  for (lVar4 = 0x50; lVar4 != 0xc50; lVar4 = lVar4 + 0x60) {
    *(undefined8 *)((long)auStack_1c90 + lVar4) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1c90 + lVar4 + 8) = 0x7f8000007f800000;
    *(undefined8 *)(local_1c80 + lVar4) = 0xff800000ff800000;
    *(undefined8 *)(local_1c80 + lVar4 + 8) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1cb0 + lVar4) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1cb0 + lVar4 + 8) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1ca0 + lVar4) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1ca0 + lVar4 + 8) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1cd0 + lVar4) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1cd0 + lVar4 + 8) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1cc0 + lVar4) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1cc0 + lVar4 + 8) = 0xff800000ff800000;
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6 = puVar6 + 2;
  }
  uVar1 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar2 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar18 = (float)(uVar2 - uVar1) * 0.05 + 4.0;
  uVar5 = (ulong)fVar18;
  paVar14 = (anon_class_16_2_f160e5ca *)
            ((long)(fVar18 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
  local_1ec8.func = (anon_class_16_2_f160e5ca *)&DAT_00000020;
  if (paVar14 < (anon_class_16_2_f160e5ca *)&DAT_00000020) {
    local_1ec8.func = paVar14;
  }
  local_1ec8.reduction = (anon_class_8_1_a667e50d *)&local_1ec8.func;
  local_1eb0 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[0];
  fStack_1eac = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  fStack_1ea8 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[2];
  fStack_1ea4 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  auVar32._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - local_1eb0;
  auVar32._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fStack_1eac;
  auVar32._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fStack_1ea8;
  auVar32._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fStack_1ea4;
  auVar31._0_4_ = (float)(long)local_1ec8.func * 0.99;
  auVar39 = maxps(_DAT_01f46b30,auVar32);
  auVar31._4_4_ = auVar31._0_4_;
  auVar31._8_4_ = auVar31._0_4_;
  auVar31._12_4_ = auVar31._0_4_;
  auVar32 = divps(auVar31,auVar39);
  local_1ea0.m128[0] = (float)(-(uint)((float)DAT_01f46b30 < auVar39._0_4_) & auVar32._0_4_);
  local_1ea0.m128[1] = (float)(-(uint)(DAT_01f46b30._4_4_ < auVar39._4_4_) & auVar32._4_4_);
  local_1ea0.m128[2] = (float)(-(uint)(DAT_01f46b30._8_4_ < auVar39._8_4_) & auVar32._8_4_);
  local_1ea0.m128[3] = (float)(-(uint)(DAT_01f46b30._12_4_ < auVar39._12_4_) & auVar32._12_4_);
  local_1e90._0_8_ = this;
  local_1e90._8_8_ = local_1ec8.reduction;
  tbb::detail::d1::task_group_context::task_group_context(local_1e80,(context_traits)0x4,CUSTOM_CTX)
  ;
  local_1ed0 = 0x400;
  local_1ef0._0_8_ = &local_1ec8;
  local_1ef0._8_8_ = &local_1e90;
  local_1ee0 = uVar2;
  uStack_1ed8 = uVar1;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long,embree::sse2::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long,embree::sse2::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&,embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BinInfoT<32u___:Vec3fa>>const__embree__sse2__BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const___1_>
            ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80,
             (d1 *)&local_1ee0,(blocked_range<unsigned_long> *)local_1c80,
             (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)&local_1ef0.field_1,
             &local_1ec8,(anon_class_8_1_a667e50d *)local_1e80,in_stack_ffffffffffffe0c0);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar3 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(local_1e80);
    BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80,
               (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80);
    lVar7 = (long)local_1ec8.func * 0x60 + -0x10;
    lVar4 = (long)local_1ec8.func * 0x10 + 0xbf0;
    iVar19 = 0;
    iVar21 = 0;
    iVar23 = 0;
    iVar25 = 0;
    aVar28 = _DAT_01f45a30;
    aVar33 = _DAT_01f45a40;
    aVar35 = _DAT_01f45a30;
    aVar40 = _DAT_01f45a40;
    aVar45 = _DAT_01f45a30;
    aVar48 = _DAT_01f45a40;
    lVar9 = (long)local_1ec8.func * 0x10;
    for (paVar14 = (anon_class_16_2_f160e5ca *)0x1; local_1ec8.func != paVar14;
        paVar14 = (anon_class_16_2_f160e5ca *)((long)&paVar14->this + 1)) {
      iVar19 = iVar19 + *(int *)(local_1c80 + lVar4);
      iVar21 = iVar21 + *(int *)(local_1c80 + lVar4 + 4);
      iVar23 = iVar23 + *(int *)(local_1c80 + lVar4 + 8);
      iVar25 = iVar25 + *(int *)(local_1c80 + lVar4 + 0xc);
      aVar35.m128 = (__m128)minps(aVar35.m128,*(undefined1 (*) [16])((long)auStack_1cd0 + lVar7));
      aVar40.m128 = (__m128)maxps(aVar40.m128,*(undefined1 (*) [16])((long)auStack_1cc0 + lVar7));
      *(int *)((long)&local_1e90 + lVar9) = iVar19;
      *(int *)((long)&local_1e90 + lVar9 + 4) = iVar21;
      *(int *)(local_1e80[0].padding + lVar9 + -0x50) = iVar23;
      *(int *)(local_1e80[0].padding + lVar9 + -0x4c) = iVar25;
      aVar28.m128 = (__m128)minps(aVar28.m128,*(undefined1 (*) [16])((long)auStack_1cb0 + lVar7));
      fVar18 = aVar40.m128[1] - aVar35.m128[1];
      fVar42 = aVar40.m128[2] - aVar35.m128[2];
      aVar33.m128 = (__m128)maxps(aVar33.m128,*(undefined1 (*) [16])((long)auStack_1ca0 + lVar7));
      fVar43 = aVar33.m128[1] - aVar28.m128[1];
      fVar44 = aVar33.m128[2] - aVar28.m128[2];
      aVar45.m128 = (__m128)minps(aVar45.m128,*(undefined1 (*) [16])((long)auStack_1c90 + lVar7));
      aVar48.m128 = (__m128)maxps(aVar48.m128,*(undefined1 (*) [16])(local_1c80 + lVar7));
      *(ulong *)(local_1c80 + lVar9 + 0xdf0) =
           CONCAT44((aVar33.m128[0] - aVar28.m128[0]) * (fVar43 + fVar44) + fVar44 * fVar43,
                    (aVar40.m128[0] - aVar35.m128[0]) * (fVar18 + fVar42) + fVar42 * fVar18);
      fVar18 = aVar48.m128[1] - aVar45.m128[1];
      fVar42 = aVar48.m128[2] - aVar45.m128[2];
      *(float *)(local_1c80 + lVar9 + 0xdf8) =
           (fVar18 + fVar42) * (aVar48.m128[0] - aVar45.m128[0]) + fVar42 * fVar18;
      *(undefined4 *)((long)&uStack_e84 + lVar9) = 0;
      lVar7 = lVar7 + -0x60;
      lVar4 = lVar4 + -0x10;
      lVar9 = lVar9 + -0x10;
    }
    uVar5 = 0xffffffffffffffff;
    uVar11 = ~(-1 << ((byte)logBlockSize & 0x1f));
    uVar34 = 1;
    uVar36 = 1;
    uVar37 = 1;
    uVar38 = 1;
    fVar18 = (float)DAT_01f45a30;
    fVar42 = DAT_01f45a30._4_4_;
    fVar43 = DAT_01f45a30._8_4_;
    fVar44 = DAT_01f45a30._12_4_;
    local_1ef0.m128[0] = (float)0;
    local_1ef0.m128[1] = (float)0;
    local_1ef0.m128[2] = (float)0;
    local_1ef0.m128[3] = (float)0;
    pauVar13 = (undefined1 (*) [16])(local_1c80 + 0x50);
    lVar4 = 0;
    iVar19 = 0;
    iVar21 = 0;
    iVar23 = 0;
    iVar25 = 0;
    aVar28 = _DAT_01f45a40;
    aVar33 = _DAT_01f45a40;
    aVar35 = _DAT_01f45a30;
    aVar40 = _DAT_01f45a30;
    aVar45 = _DAT_01f45a30;
    aVar48 = _DAT_01f45a40;
    for (paVar14 = (anon_class_16_2_f160e5ca *)0x1; paVar14 < local_1ec8.func;
        paVar14 = (anon_class_16_2_f160e5ca *)((long)&paVar14->this + 1)) {
      aVar45.m128 = (__m128)minps(aVar45.m128,pauVar13[-5]);
      aVar48.m128 = (__m128)maxps(aVar48.m128,pauVar13[-4]);
      aVar40.m128 = (__m128)minps(aVar40.m128,pauVar13[-3]);
      aVar33.m128 = (__m128)maxps(aVar33.m128,pauVar13[-2]);
      fVar53 = aVar48.m128[1] - aVar45.m128[1];
      fVar54 = aVar48.m128[2] - aVar45.m128[2];
      aVar35.m128 = (__m128)minps(aVar35.m128,pauVar13[-1]);
      fVar46 = aVar33.m128[1] - aVar40.m128[1];
      fVar47 = aVar33.m128[2] - aVar40.m128[2];
      aVar28.m128 = (__m128)maxps(aVar28.m128,*pauVar13);
      fVar27 = aVar28.m128[0] - aVar35.m128[0];
      fVar29 = aVar28.m128[1] - aVar35.m128[1];
      fVar30 = aVar28.m128[2] - aVar35.m128[2];
      iVar19 = iVar19 + *(int *)(local_1c80 + lVar4 + 0xc00);
      iVar21 = iVar21 + *(int *)(local_1c80 + lVar4 + 0xc04);
      iVar23 = iVar23 + *(int *)(local_1c80 + lVar4 + 0xc08);
      iVar25 = iVar25 + *(int *)(local_1c80 + lVar4 + 0xc0c);
      uVar12 = logBlockSize & 0xffffffff;
      uVar20 = iVar19 + uVar11 >> uVar12;
      uVar22 = iVar21 + uVar11 >> uVar12;
      uVar24 = iVar23 + uVar11 >> uVar12;
      uVar26 = iVar25 + uVar11 >> uVar12;
      uVar49 = *(int *)(local_1e80[0].padding + lVar4 + -0x38) + uVar11 >> uVar12;
      uVar50 = *(int *)(local_1e80[0].padding + lVar4 + -0x34) + uVar11 >> uVar12;
      uVar51 = *(int *)(local_1e80[0].padding + lVar4 + -0x30) + uVar11 >> uVar12;
      uVar52 = *(int *)(local_1e80[0].padding + lVar4 + -0x2c) + uVar11 >> uVar12;
      auVar41._0_4_ =
           ((float)(uVar49 & 0x7fffffff) + (float)((int)uVar49 >> 0x1f & 0x4f000000)) *
           *(float *)(local_e80 + lVar4 + 0x10) +
           ((float)(uVar20 & 0x7fffffff) + (float)((int)uVar20 >> 0x1f & 0x4f000000)) *
           ((aVar48.m128[0] - aVar45.m128[0]) * (fVar53 + fVar54) + fVar54 * fVar53);
      auVar41._4_4_ =
           ((float)(uVar50 & 0x7fffffff) + (float)((int)uVar50 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_e6c + lVar4) +
           ((float)(uVar22 & 0x7fffffff) + (float)((int)uVar22 >> 0x1f & 0x4f000000)) *
           ((aVar33.m128[0] - aVar40.m128[0]) * (fVar46 + fVar47) + fVar47 * fVar46);
      auVar41._8_4_ =
           ((float)(uVar51 & 0x7fffffff) + (float)((int)uVar51 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_e6c + lVar4 + 4) +
           ((float)(uVar24 & 0x7fffffff) + (float)((int)uVar24 >> 0x1f & 0x4f000000)) *
           (fVar27 * (fVar30 + fVar29) + fVar29 * fVar30);
      auVar41._12_4_ =
           ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_e6c + lVar4 + 8) +
           ((float)(uVar26 & 0x7fffffff) + (float)((int)uVar26 >> 0x1f & 0x4f000000)) *
           (fVar27 * (fVar29 + fVar30) + fVar30 * fVar29);
      local_1ef0.m128[0] =
           (float)((uint)local_1ef0.m128[0] & -(uint)(fVar18 <= auVar41._0_4_) |
                  ~-(uint)(fVar18 <= auVar41._0_4_) & uVar34);
      local_1ef0.m128[1] =
           (float)((uint)local_1ef0.m128[1] & -(uint)(fVar42 <= auVar41._4_4_) |
                  ~-(uint)(fVar42 <= auVar41._4_4_) & uVar36);
      local_1ef0.m128[2] =
           (float)((uint)local_1ef0.m128[2] & -(uint)(fVar43 <= auVar41._8_4_) |
                  ~-(uint)(fVar43 <= auVar41._8_4_) & uVar37);
      local_1ef0.m128[3] =
           (float)((uint)local_1ef0.m128[3] & -(uint)(fVar44 <= auVar41._12_4_) |
                  ~-(uint)(fVar44 <= auVar41._12_4_) & uVar38);
      auVar39._4_4_ = fVar42;
      auVar39._0_4_ = fVar18;
      auVar39._8_4_ = fVar43;
      auVar39._12_4_ = fVar44;
      auVar32 = minps(auVar41,auVar39);
      uVar34 = uVar34 + 1;
      uVar36 = uVar36 + 1;
      uVar37 = uVar37 + 1;
      uVar38 = uVar38 + 1;
      lVar4 = lVar4 + 0x10;
      pauVar13 = pauVar13 + 6;
      fVar18 = auVar32._0_4_;
      fVar42 = auVar32._4_4_;
      fVar43 = auVar32._8_4_;
      fVar44 = auVar32._12_4_;
    }
    local_1ee0 = CONCAT44(fVar42,fVar18);
    uStack_1ed8 = CONCAT44(fVar44,fVar43);
    fVar18 = INFINITY;
    iVar19 = 0;
    for (uVar12 = 0; uVar12 != 3; uVar12 = uVar12 + 1) {
      fVar42 = *(float *)((long)&local_1ea0 + uVar12 * 4);
      if ((((fVar42 != 0.0) || (NAN(fVar42))) &&
          (fVar42 = *(float *)((long)&local_1ee0 + uVar12 * 4), fVar42 < fVar18)) &&
         (iVar21 = *(int *)((long)&local_1ef0 + uVar12 * 4), iVar21 != 0)) {
        uVar5 = uVar12 & 0xffffffff;
        iVar19 = iVar21;
        fVar18 = fVar42;
      }
    }
    __return_storage_ptr__->sah = fVar18;
    iVar21 = (int)uVar5;
    __return_storage_ptr__->dim = iVar21;
    (__return_storage_ptr__->field_2).pos = iVar19;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = (size_t)local_1ec8.func;
    *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 = CONCAT44(fStack_1eac,local_1eb0);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
         CONCAT44(fStack_1ea4,fStack_1ea8);
    *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 =
         CONCAT44(local_1ea0.m128[1],local_1ea0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
         CONCAT44(local_1ea0.m128[3],local_1ea0.m128[2]);
    if (iVar21 == -1) {
      info->leftCount = 0;
      info->rightCount = 0;
      aVar28 = _DAT_01f45a30;
      (info->leftBounds).lower.field_0 = _DAT_01f45a30;
      aVar33 = _DAT_01f45a40;
      aVar35 = _DAT_01f45a40;
    }
    else {
      paVar8 = (anon_class_16_2_f160e5ca *)(long)iVar19;
      lVar4 = (long)iVar21;
      puVar15 = (uint *)(local_1c80 + lVar4 * 4 + 0xc00);
      pauVar13 = (undefined1 (*) [16])(local_1c80 + lVar4 * 0x20 + 0x10);
      sVar10 = 0;
      paVar14 = paVar8;
      aVar33 = _DAT_01f45a40;
      aVar40 = _DAT_01f45a30;
      while (bVar17 = paVar14 != (anon_class_16_2_f160e5ca *)0x0,
            paVar14 = (anon_class_16_2_f160e5ca *)((long)&paVar14[-1]._mapping + 7), bVar17) {
        sVar10 = sVar10 + *puVar15;
        aVar40.m128 = (__m128)minps(aVar40.m128,pauVar13[-1]);
        aVar33.m128 = (__m128)maxps(aVar33.m128,*pauVar13);
        puVar15 = puVar15 + 4;
        pauVar13 = pauVar13 + 6;
      }
      puVar15 = (uint *)(local_1c80 + (long)paVar8 * 0x10 + lVar4 * 4 + 0xc00);
      pauVar13 = (undefined1 (*) [16])(local_1c80 + (long)paVar8 * 0x60 + lVar4 * 0x20 + 0x10);
      sVar16 = 0;
      aVar28 = _DAT_01f45a30;
      aVar35 = _DAT_01f45a40;
      for (; paVar8 < local_1ec8.func;
          paVar8 = (anon_class_16_2_f160e5ca *)((long)&paVar8->this + 1)) {
        aVar28.m128 = (__m128)minps(aVar28.m128,pauVar13[-1]);
        aVar35.m128 = (__m128)maxps(aVar35.m128,*pauVar13);
        sVar16 = sVar16 + *puVar15;
        puVar15 = puVar15 + 4;
        pauVar13 = pauVar13 + 6;
      }
      info->leftCount = sVar10;
      info->rightCount = sVar16;
      (info->leftBounds).lower.field_0 = aVar40;
    }
    (info->leftBounds).upper.field_0 = aVar33;
    (info->rightBounds).lower.field_0 = aVar28;
    (info->rightBounds).upper.field_0 = aVar35;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty);
          const BinMapping<OBJECT_BINS> mapping(set);
          const BinMapping<OBJECT_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> ObjectBinner { ObjectBinner binner(empty); binner.bin(prims0+r.begin(),r.size(),_mapping); return binner; },
                                   [&] (const ObjectBinner& b0, const ObjectBinner& b1) -> ObjectBinner { ObjectBinner r = b0; r.merge(b1,_mapping.size()); return r; });
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }